

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O0

double s2polyline_alignment::BoundsCheckedTableCost
                 (int row,int col,ColumnStride *stride,CostTable *table)

{
  bool bVar1;
  const_reference this;
  const_reference pvVar2;
  CostTable *table_local;
  ColumnStride *stride_local;
  int col_local;
  int row_local;
  
  if ((row < 0) && (col < 0)) {
    _col_local = 0.0;
  }
  else {
    if ((-1 < row) && ((-1 < col && (bVar1 = ColumnStride::InRange(stride,col), bVar1)))) {
      this = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](table,(long)row);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this,(long)col);
      return *pvVar2;
    }
    _col_local = 1.79769313486232e+308;
  }
  return _col_local;
}

Assistant:

inline double BoundsCheckedTableCost(const int row, const int col,
                                     const ColumnStride& stride,
                                     const CostTable& table) {
  if (row < 0 && col < 0) {
    return 0.0;
  } else if (row < 0 || col < 0 || !stride.InRange(col)) {
    return DOUBLE_MAX;
  } else {
    return table[row][col];
  }
}